

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O2

EncConfig * __thiscall QPDFJob::EncConfig::print(EncConfig *this,string *parameter)

{
  bool bVar1;
  allocator<char> local_31;
  string local_30;
  
  if (((this->config->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->keylen == 0x28) {
    bVar1 = std::operator==(parameter,"y");
    ((this->config->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    r2_print = bVar1;
  }
  else {
    bVar1 = std::operator==(parameter,"full");
    if (bVar1) {
      ((this->config->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->r3_print = qpdf_r3p_full;
    }
    else {
      bVar1 = std::operator==(parameter,"low");
      if (bVar1) {
        ((this->config->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->r3_print = qpdf_r3p_low;
      }
      else {
        bVar1 = std::operator==(parameter,"none");
        if (bVar1) {
          ((this->config->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->r3_print = qpdf_r3p_none;
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_30,"invalid print option",&local_31);
          usage(&local_30);
          std::__cxx11::string::~string((string *)&local_30);
        }
      }
    }
  }
  return this;
}

Assistant:

QPDFJob::EncConfig*
QPDFJob::EncConfig::print(std::string const& parameter)
{
    if (config->o.m->keylen == 40) {
        config->o.m->r2_print = (parameter == "y");
    } else if (parameter == "full") {
        config->o.m->r3_print = qpdf_r3p_full;
    } else if (parameter == "low") {
        config->o.m->r3_print = qpdf_r3p_low;
    } else if (parameter == "none") {
        config->o.m->r3_print = qpdf_r3p_none;
    } else {
        usage("invalid print option");
    }
    return this;
}